

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv2_gears.c
# Opt level: O1

void rotate(float *a,float r,float ux,float uy,float uz)

{
  float fVar1;
  float c;
  float s;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  undefined4 local_4c;
  float local_48;
  float local_44;
  float local_40;
  undefined4 local_3c;
  float local_38;
  float local_34;
  float local_30;
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined4 local_1c;
  
  sincosf((r * 3.1415927) / 180.0,&local_5c,&local_60);
  fVar1 = 1.0 - local_60;
  local_58 = ux * ux * fVar1 + local_60;
  local_48 = ux * uy * fVar1;
  local_54 = local_48 + local_5c * uz;
  local_38 = ux * uz * fVar1;
  local_50 = local_38 - local_5c * uy;
  local_4c = 0;
  local_48 = local_48 - local_5c * uz;
  local_44 = uy * uy * fVar1 + local_60;
  local_34 = uy * uz * fVar1;
  local_40 = local_34 + local_5c * ux;
  local_3c = 0;
  local_38 = local_5c * uy + local_38;
  local_34 = local_34 - local_5c * ux;
  local_30 = uz * uz * fVar1 + local_60;
  local_2c = 0;
  uStack_24 = 0;
  local_1c = 0x3f800000;
  multiply(a,&local_58);
  return;
}

Assistant:

static void rotate(float *a, float r, float ux, float uy, float uz)
{
  float s, c;

  sincosf(r * M_PI / 180, &s, &c);

  float m[16] = {
         ux * ux * (1 - c) + c, uy * ux * (1 - c) + uz * s, ux * uz * (1 - c) - uy * s, 0,
    ux * uy * (1 - c) - uz * s,      uy * uy * (1 - c) + c, uy * uz * (1 - c) + ux * s, 0,
    ux * uz * (1 - c) + uy * s, uy * uz * (1 - c) - ux * s,      uz * uz * (1 - c) + c, 0,
                             0,                          0,                          0, 1
  };

  multiply(a, m);
}